

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineLayoutVk.cpp
# Opt level: O2

void __thiscall Diligent::PipelineLayoutVk::~PipelineLayoutVk(PipelineLayoutVk *this)

{
  string msg;
  
  if ((this->m_VkPipelineLayout).m_VkObject != (VkPipelineLayout_T *)0x0) {
    FormatString<char[40]>(&msg,(char (*) [40])"Pipeline layout have not been released!");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"~PipelineLayoutVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineLayoutVk.cpp"
               ,0x33);
    std::__cxx11::string::~string((string *)&msg);
  }
  VulkanUtilities::
  VulkanObjectWrapper<VkPipelineLayout_T_*,_(VulkanUtilities::VulkanHandleTypeId)11>::
  ~VulkanObjectWrapper(&this->m_VkPipelineLayout);
  return;
}

Assistant:

PipelineLayoutVk::~PipelineLayoutVk()
{
    VERIFY(!m_VkPipelineLayout, "Pipeline layout have not been released!");
}